

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineOption.cpp
# Opt level: O3

string * __thiscall
senjo::EngineOption::GetTypeName_abi_cxx11_
          (string *__return_storage_ptr__,EngineOption *this,OptionType type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((int)this) {
  case 1:
    pcVar2 = "button";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "check";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "combo";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "spin";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "string";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "unknown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string EngineOption::GetTypeName(const EngineOption::OptionType type)
{
  switch (type) {
  case OptionType::Button:   return OPT_BUTTON_NAME;
  case OptionType::Checkbox: return OPT_CHECK_NAME;
  case OptionType::ComboBox: return OPT_COMBO_NAME;
  case OptionType::Spin:     return OPT_SPIN_NAME;
  case OptionType::String:   return OPT_STRING_NAME;
  default:
    break;
  }
  return OPT_UNKNOWN_NAME;
}